

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void ScalePlaneBilinearUp_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  uint16_t *puVar1;
  ulong uVar2;
  long lVar3;
  code *pcVar4;
  undefined4 in_register_00000014;
  ptrdiff_t src_stride_00;
  uint uVar5;
  uint source_y_fraction;
  uint16_t *src_ptr_00;
  int iVar6;
  int iVar7;
  int y;
  int local_88;
  int x;
  code *local_80;
  int dx;
  uint16_t *local_70;
  uint16_t *local_68;
  ulong local_60;
  uint16_t *local_58;
  int local_50;
  int dy;
  long local_48;
  void *local_40;
  uint16_t *local_38;
  
  local_60 = CONCAT44(in_register_00000014,dst_width);
  x = 0;
  y = 0;
  dx = 0;
  dy = 0;
  local_88 = src_height << 0x10;
  local_68 = (uint16_t *)CONCAT44(local_68._4_4_,src_height);
  local_50 = dst_stride;
  ScaleSlope(src_width,src_height,dst_width,dst_height,filtering,&x,&y,&dx,&dy);
  uVar2 = local_60;
  uVar5 = -src_width;
  if (0 < src_width) {
    uVar5 = src_width;
  }
  if (uVar5 < 0x8000) {
    local_80 = ScaleFilterCols_16_C;
  }
  else {
    local_80 = ScaleFilterCols64_16_C;
  }
  local_88 = local_88 + -0x10000;
  if (filtering == kFilterNone) {
    pcVar4 = ScaleCols_16_C;
    if (x < 0x8000) {
      pcVar4 = ScaleColsUp2_16_C;
    }
    local_80 = ScaleCols_16_C;
    if (uVar5 * 2 == (int)local_60) {
      local_80 = pcVar4;
    }
  }
  if (local_88 < y) {
    y = local_88;
  }
  iVar7 = (int)y._2_2_;
  local_70 = (uint16_t *)CONCAT44(local_70._4_4_,src_stride);
  uVar5 = (int)local_60 + 0x1fU & 0xffffffe0;
  local_58 = src_ptr + iVar7 * src_stride;
  local_40 = malloc((long)(int)(uVar5 * 4 + 0x3f));
  pcVar4 = local_80;
  src_ptr_00 = (uint16_t *)((long)local_40 + 0x3fU & 0xffffffffffffffc0);
  (*local_80)(src_ptr_00,src_ptr + iVar7 * src_stride,uVar2 & 0xffffffff,x,dx);
  local_48 = (long)(int)local_70;
  lVar3 = 0;
  if (1 < (int)local_68) {
    lVar3 = local_48;
  }
  local_68 = local_58 + lVar3;
  (*pcVar4)(src_ptr_00 + (int)uVar5,local_68,uVar2 & 0xffffffff,x);
  if (0 < dst_height) {
    local_70 = local_68 + local_48;
    local_58 = (uint16_t *)CONCAT44(local_58._4_4_,local_88 >> 0x10);
    local_38 = src_ptr + (int)local_48 * (local_88 >> 0x10);
    local_68 = (uint16_t *)((long)local_50 * 2);
    do {
      if (y >> 0x10 != iVar7) {
        iVar6 = y >> 0x10;
        if (local_88 < y) {
          y = local_88;
          local_70 = local_38;
          iVar6 = (int)local_58;
        }
        puVar1 = local_70;
        if (iVar6 != iVar7) {
          (*local_80)(src_ptr_00,local_70,local_60,x);
          src_ptr_00 = src_ptr_00 + (int)uVar5;
          uVar5 = -uVar5;
          local_70 = puVar1 + local_48;
          iVar7 = iVar6;
        }
      }
      if (filtering == kFilterLinear) {
        src_stride_00 = 0;
        source_y_fraction = 0;
      }
      else {
        source_y_fraction = (uint)y >> 8 & 0xff;
        src_stride_00 = (ptrdiff_t)(int)uVar5;
      }
      InterpolateRow_16_C(dst_ptr,src_ptr_00,src_stride_00,(int)local_60,source_y_fraction);
      y = y + dy;
      dst_ptr = (uint16_t *)((long)dst_ptr + (long)local_68);
      dst_height = dst_height + -1;
    } while (dst_height != 0);
  }
  free(local_40);
  return;
}

Assistant:

void ScalePlaneBilinearUp_16(int src_width,
                             int src_height,
                             int dst_width,
                             int dst_height,
                             int src_stride,
                             int dst_stride,
                             const uint16_t* src_ptr,
                             uint16_t* dst_ptr,
                             enum FilterMode filtering) {
  int j;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  const int max_y = (src_height - 1) << 16;
  void (*InterpolateRow)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_16_C;
  void (*ScaleFilterCols)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                          int dst_width, int x, int dx) =
      filtering ? ScaleFilterCols_16_C : ScaleCols_16_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    InterpolateRow = InterpolateRow_Any_16_SSE2;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSE2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_16_SSSE3;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_16_AVX2;
    if (IS_ALIGNED(dst_width, 32)) {
      InterpolateRow = InterpolateRow_16_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_16_NEON;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_16_NEON;
    }
  }
#endif

  if (filtering && src_width >= 32768) {
    ScaleFilterCols = ScaleFilterCols64_16_C;
  }
#if defined(HAS_SCALEFILTERCOLS_16_SSSE3)
  if (filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_16_SSSE3;
  }
#endif
  if (!filtering && src_width * 2 == dst_width && x < 0x8000) {
    ScaleFilterCols = ScaleColsUp2_16_C;
#if defined(HAS_SCALECOLS_16_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_16_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_16_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_16_MMI;
    }
#endif
  }

  if (y > max_y) {
    y = max_y;
  }
  {
    int yi = y >> 16;
    const uint16_t* src = src_ptr + yi * src_stride;

    // Allocate 2 row buffers.
    const int kRowSize = (dst_width + 31) & ~31;
    align_buffer_64(row, kRowSize * 4);

    uint16_t* rowptr = (uint16_t*)row;
    int rowstride = kRowSize;
    int lasty = yi;

    ScaleFilterCols(rowptr, src, dst_width, x, dx);
    if (src_height > 1) {
      src += src_stride;
    }
    ScaleFilterCols(rowptr + rowstride, src, dst_width, x, dx);
    src += src_stride;

    for (j = 0; j < dst_height; ++j) {
      yi = y >> 16;
      if (yi != lasty) {
        if (y > max_y) {
          y = max_y;
          yi = y >> 16;
          src = src_ptr + yi * src_stride;
        }
        if (yi != lasty) {
          ScaleFilterCols(rowptr, src, dst_width, x, dx);
          rowptr += rowstride;
          rowstride = -rowstride;
          lasty = yi;
          src += src_stride;
        }
      }
      if (filtering == kFilterLinear) {
        InterpolateRow(dst_ptr, rowptr, 0, dst_width, 0);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(dst_ptr, rowptr, rowstride, dst_width, yf);
      }
      dst_ptr += dst_stride;
      y += dy;
    }
    free_aligned_buffer_64(row);
  }
}